

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O1

bool __thiscall
gvr::MultiTexturedMesh::getUsedByTexture
          (MultiTexturedMesh *this,int t,vector<bool,_std::allocator<bool>_> *vused,
          vector<bool,_std::allocator<bool>_> *tused)

{
  ulong *puVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint *puVar10;
  int *piVar11;
  
  std::vector<bool,_std::allocator<bool>_>::resize
            (vused,(long)(this->super_Mesh).super_PointCloud.n,false);
  std::vector<bool,_std::allocator<bool>_>::resize(tused,(long)(this->super_Mesh).n,false);
  uVar7 = (ulong)(this->super_Mesh).super_PointCloud.n;
  if (0 < (long)uVar7) {
    lVar9 = *(long *)vused;
    uVar8 = 0;
    do {
      bVar5 = (byte)uVar8 & 0x3f;
      puVar1 = (ulong *)(lVar9 + (uVar8 >> 6) * 8);
      *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  iVar2 = (this->super_Mesh).n;
  uVar7 = (ulong)iVar2;
  if (0 < (long)uVar7) {
    lVar9 = *(long *)tused;
    uVar8 = 0;
    do {
      bVar5 = (byte)uVar8 & 0x3f;
      puVar1 = (ulong *)(lVar9 + (uVar8 >> 6) * 8);
      *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  if (iVar2 < 1) {
    bVar6 = false;
  }
  else {
    lVar3 = *(long *)vused;
    lVar4 = *(long *)tused;
    lVar9 = uVar7 + 1;
    puVar10 = (this->super_Mesh).triangle + uVar7 * 3 + -1;
    piVar11 = &this->uvt[uVar7 - 1].t;
    bVar6 = false;
    do {
      if (*piVar11 == t) {
        puVar1 = (ulong *)(lVar3 + (ulong)(puVar10[-2] >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)puVar10[-2] & 0x3f);
        puVar1 = (ulong *)(lVar3 + (ulong)(puVar10[-1] >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)puVar10[-1] & 0x3f);
        puVar1 = (ulong *)(lVar3 + (ulong)(*puVar10 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)*puVar10 & 0x3f);
        puVar1 = (ulong *)(lVar4 + (lVar9 - 2U >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)(lVar9 - 2U) & 0x3f);
        bVar6 = true;
      }
      lVar9 = lVar9 + -1;
      puVar10 = puVar10 + -3;
      piVar11 = piVar11 + -7;
    } while (1 < lVar9);
  }
  return bVar6;
}

Assistant:

bool MultiTexturedMesh::getUsedByTexture(int t, std::vector<bool> &vused, std::vector<bool> &tused)
{
  vused.resize(getVertexCount());
  tused.resize(getTriangleCount());

  for (int i=0; i<getVertexCount(); i++)
  {
    vused[i]=false;
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    tused[i]=false;
  }

  bool ret=false;

  for (int i=getTriangleCount()-1; i>=0; i--)
  {
    if (getTextureIndex(i) == t)
    {
      vused[getTriangleIndex(i, 0)]=true;
      vused[getTriangleIndex(i, 1)]=true;
      vused[getTriangleIndex(i, 2)]=true;
      tused[i]=true;
      ret=true;
    }
  }

  return ret;
}